

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_error.hpp
# Opt level: O2

void __thiscall
tao::pegtl::parse_error::
parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
          (parse_error *this,string *msg,
          action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  undefined1 local_50 [56];
  
  internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::position((position *)local_50,in);
  parse_error(this,msg,(position *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x18));
  return;
}

Assistant:

parse_error( const std::string& msg, const Input& in )
            : parse_error( msg, in.position() )
         {
         }